

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

CURLcode get_url_file_name(GlobalConfig *global,char **filename,char *url)

{
  char *pcVar1;
  CURLUcode ucode;
  CURLcode CVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char **ppcVar6;
  int iVar7;
  int iVar8;
  char *path;
  char **local_40;
  GlobalConfig *local_38;
  
  lVar3 = curl_url();
  path = (char *)0x0;
  if (lVar3 == 0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *filename = (char *)0x0;
    ucode = curl_url_set(lVar3,0,url);
    if (ucode == CURLUE_OK) {
      ucode = curl_url_get(lVar3,7,&path);
      curl_url_cleanup(lVar3);
      if (ucode == CURLUE_OK) {
        pcVar5 = (char *)0x0;
        local_40 = filename;
        local_38 = global;
        iVar8 = 2;
        while (iVar7 = iVar8, pcVar1 = path, iVar8 = iVar7 + -1, iVar7 != 0) {
          pcVar4 = strrchr(path,0x2f);
          pcVar5 = pcVar4 + 1;
          if (pcVar4 == (char *)0x0) {
            pcVar5 = pcVar1;
          }
          pcVar5 = strrchr(pcVar5,0x5c);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = pcVar4;
          }
          if (((pcVar5 != (char *)0x0) && (iVar7 == 2)) && (pcVar5[1] == '\0')) {
            *pcVar5 = '\0';
          }
        }
        if (pcVar5 == (char *)0x0) {
          pcVar5 = strdup("curl_response");
          ppcVar6 = local_40;
          *local_40 = pcVar5;
          warnf(local_38,"No remote file name, uses \"%s\"",pcVar5);
        }
        else {
          pcVar5 = strdup(pcVar5 + 1);
          *local_40 = pcVar5;
          ppcVar6 = local_40;
        }
        curl_free(path);
        if (*ppcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        return CURLE_OK;
      }
      lVar3 = 0;
    }
    curl_url_cleanup(lVar3);
    CVar2 = urlerr_cvt(ucode);
  }
  return CVar2;
}

Assistant:

CURLcode get_url_file_name(struct GlobalConfig *global,
                           char **filename, const char *url)
{
  CURLU *uh = curl_url();
  char *path = NULL;
  CURLUcode uerr;

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  *filename = NULL;

  uerr = curl_url_set(uh, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
  if(!uerr) {
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    curl_url_cleanup(uh);
    uh = NULL;
    if(!uerr) {
      int i;
      char *pc = NULL, *pc2 = NULL;
      for(i = 0; i < 2; i++) {
        pc = strrchr(path, '/');
        pc2 = strrchr(pc ? pc + 1 : path, '\\');
        if(pc2)
          pc = pc2;
        if(pc && !pc[1] && !i) {
          /* if the path ends with slash, try removing the trailing one
             and get the last directory part */
          *pc = 0;
        }
      }

      if(pc) {
        /* duplicate the string beyond the slash */
        *filename = strdup(pc + 1);
      }
      else {
        /* no slash => empty string, use default */
        *filename = strdup("curl_response");
        warnf(global, "No remote file name, uses \"%s\"", *filename);
      }

      curl_free(path);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
      {
        char *sanitized;
        SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
        curlx_safefree(*filename);
        if(sc) {
          if(sc == SANITIZE_ERR_OUT_OF_MEMORY)
            return CURLE_OUT_OF_MEMORY;
          return CURLE_URL_MALFORMAT;
        }
        *filename = sanitized;
      }
#endif /* _WIN32 || MSDOS */

      return CURLE_OK;
    }
  }
  curl_url_cleanup(uh);
  return urlerr_cvt(uerr);
}